

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::Persistence_landscape::new_abs(Persistence_landscape *this)

{
  double dVar1;
  pair<double,_double> p2;
  pointer ppVar2;
  int iVar3;
  Persistence_landscape *this_00;
  pointer ppVar4;
  ostream *poVar5;
  void *pvVar6;
  reference pvVar7;
  double dVar8;
  reference pvVar9;
  reference pvVar10;
  pair<double,_double> pVar11;
  pair<double,_int> pVar12;
  double local_100;
  value_type local_f8;
  double local_e8;
  value_type local_e0;
  double local_d0;
  int local_c8;
  int local_bc;
  pair<double,_int> local_b8;
  pair<double,_double> local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double zero;
  size_t i;
  pair<int,_int> local_60;
  pair<double,_double> local_58;
  undefined1 local_48 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  size_t level;
  Persistence_landscape *result;
  Persistence_landscape *this_local;
  
  this_00 = (Persistence_landscape *)operator_new(0x28);
  Persistence_landscape(this_00,this);
  for (lambda_n.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppVar2 = lambda_n.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
      ppVar4 = (pointer)std::
                        vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                        ::size(&this->land), ppVar2 != ppVar4;
      lambda_n.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(lambda_n.
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1)) {
    if ((AbsDbg & 1) != 0) {
      poVar5 = std::operator<<((ostream *)&std::clog,"level: ");
      pvVar6 = (void *)std::ostream::operator<<
                                 (poVar5,(ulong)lambda_n.
                                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_48);
    iVar3 = std::numeric_limits<int>::max();
    i._4_4_ = -iVar3;
    i._0_4_ = 0;
    local_60 = std::make_pair<int,int>((int *)((long)&i + 4),(int *)&i);
    std::pair<double,_double>::pair<int,_int,_true>(&local_58,&local_60);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_48,&local_58);
    zero = 4.94065645841247e-324;
    while( true ) {
      dVar1 = zero;
      pvVar7 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,
                            (size_type)
                            lambda_n.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      dVar8 = (double)std::
                      vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ::size(pvVar7);
      if (dVar1 == dVar8) break;
      if ((AbsDbg & 1) != 0) {
        poVar5 = std::operator<<((ostream *)&std::clog,"this->land[");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,(ulong)lambda_n.
                                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar5 = std::operator<<(poVar5,"][");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)zero);
        poVar5 = std::operator<<(poVar5,"] : ");
        pvVar7 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&this->land,
                              (size_type)
                              lambda_n.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar7,(size_type)zero);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar9->first);
        poVar5 = std::operator<<(poVar5," ");
        pvVar7 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&this->land,
                              (size_type)
                              lambda_n.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar7,(size_type)zero);
        pvVar6 = (void *)std::ostream::operator<<(poVar5,pvVar9->second);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      }
      pvVar7 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,
                            (size_type)
                            lambda_n.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar7,(long)zero - 1);
      dVar1 = pvVar9->second;
      pvVar7 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,
                            (size_type)
                            lambda_n.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar7,(size_type)zero);
      if (0.0 <= dVar1 * pvVar9->second) {
        pvVar7 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&this->land,
                              (size_type)
                              lambda_n.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar7,(size_type)zero);
        pvVar7 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&this->land,
                              (size_type)
                              lambda_n.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar7,(size_type)zero);
        local_100 = ABS(pvVar10->second);
        pVar11 = std::make_pair<double&,double>(&pvVar9->first,&local_100);
        local_f8.first = pVar11.first;
        local_f8.second = pVar11.second;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_48,&local_f8);
        if ((AbsDbg & 1) != 0) {
          poVar5 = std::operator<<((ostream *)&std::clog,"Adding pair : (");
          pvVar7 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&this->land,
                                (size_type)
                                lambda_n.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar7,(size_type)zero);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar9->first);
          poVar5 = std::operator<<(poVar5,",");
          pvVar7 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&this->land,
                                (size_type)
                                lambda_n.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar7,(size_type)zero);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,ABS(pvVar9->second));
          poVar5 = std::operator<<(poVar5,") ");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::istream::ignore();
        }
      }
      else {
        pvVar7 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&this->land,
                              (size_type)
                              lambda_n.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar7,(long)zero - 1);
        local_88 = pvVar9->first;
        dStack_80 = pvVar9->second;
        pvVar7 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&this->land,
                              (size_type)
                              lambda_n.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar7,(size_type)zero);
        local_98 = pvVar9->first;
        dStack_90 = pvVar9->second;
        p2.first = pvVar9->first;
        p2.second = pvVar9->second;
        pVar11.second = dStack_80;
        pVar11.first = local_88;
        local_78 = find_zero_of_a_line_segment_between_those_two_points(pVar11,p2);
        local_bc = 0;
        pVar12 = std::make_pair<double&,int>(&local_78,&local_bc);
        local_d0 = pVar12.first;
        local_c8 = pVar12.second;
        local_b8.first = local_d0;
        local_b8.second = local_c8;
        std::pair<double,_double>::pair<double,_int,_true>(&local_a8,&local_b8);
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_48,&local_a8);
        pvVar7 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&this->land,
                              (size_type)
                              lambda_n.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar7,(size_type)zero);
        pvVar7 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&this->land,
                              (size_type)
                              lambda_n.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](pvVar7,(size_type)zero);
        local_e8 = ABS(pvVar10->second);
        pVar11 = std::make_pair<double&,double>(&pvVar9->first,&local_e8);
        local_e0.first = pVar11.first;
        local_e0.second = pVar11.second;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_48,&local_e0);
        if ((AbsDbg & 1) != 0) {
          poVar5 = std::operator<<((ostream *)&std::clog,"Adding pair : (");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_78);
          poVar5 = std::operator<<(poVar5,",0)");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)&std::clog,"In the same step adding pair : (");
          pvVar7 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&this->land,
                                (size_type)
                                lambda_n.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar7,(size_type)zero);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar9->first);
          poVar5 = std::operator<<(poVar5,",");
          pvVar7 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&this->land,
                                (size_type)
                                lambda_n.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar7,(size_type)zero);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,ABS(pvVar9->second));
          poVar5 = std::operator<<(poVar5,") ");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::istream::ignore();
        }
      }
      zero = (double)((long)zero + 1);
    }
    std::
    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::push_back((vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 *)this_00,(value_type *)local_48);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_48);
  }
  return this_00;
}

Assistant:

Persistence_landscape* Persistence_landscape::new_abs() {
  Persistence_landscape* result = new Persistence_landscape(*this);
  for (size_t level = 0; level != this->land.size(); ++level) {
    if (AbsDbg) {
      std::clog << "level: " << level << std::endl;
    }
    std::vector<std::pair<double, double> > lambda_n;
    lambda_n.push_back(std::make_pair(-std::numeric_limits<int>::max(), 0));
    for (size_t i = 1; i != this->land[level].size(); ++i) {
      if (AbsDbg) {
        std::clog << "this->land[" << level << "][" << i << "] : " << this->land[level][i].first << " "
                  << this->land[level][i].second << std::endl;
      }
      // if a line segment between this->land[level][i-1] and this->land[level][i] crosses the x-axis, then we have to
      // add one landscape point t o result
      if ((this->land[level][i - 1].second) * (this->land[level][i].second) < 0) {
        double zero =
            find_zero_of_a_line_segment_between_those_two_points(this->land[level][i - 1], this->land[level][i]);

        lambda_n.push_back(std::make_pair(zero, 0));
        lambda_n.push_back(std::make_pair(this->land[level][i].first, fabs(this->land[level][i].second)));
        if (AbsDbg) {
          std::clog << "Adding pair : (" << zero << ",0)" << std::endl;
          std::clog << "In the same step adding pair : (" << this->land[level][i].first << ","
                    << fabs(this->land[level][i].second) << ") " << std::endl;
          std::cin.ignore();
        }
      } else {
        lambda_n.push_back(std::make_pair(this->land[level][i].first, fabs(this->land[level][i].second)));
        if (AbsDbg) {
          std::clog << "Adding pair : (" << this->land[level][i].first << "," << fabs(this->land[level][i].second)
                    << ") " << std::endl;
          std::cin.ignore();
        }
      }
    }
    result->land.push_back(lambda_n);
  }
  return result;
}